

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BufferBindingCase::iterate(BufferBindingCase *this)

{
  TestLog *pTVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  int ndx;
  GLuint index;
  allocator<char> local_112;
  allocator<char> local_111;
  ScopedLogSection section_1;
  string local_108;
  string local_e8;
  int maxBindings;
  CallLogWrapper gl;
  ScopedLogSection superSection;
  ScopedLogSection section;
  GLuint local_90;
  Buffer bufferB;
  ResultCollector result;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108," // ERROR: ",(allocator<char> *)&local_e8);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  maxBindings = -1;
  gl.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&gl,this->m_numBindingsTarget,&maxBindings);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0xe8);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Initial",(allocator<char> *)&bufferB);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"Initial value",(allocator<char> *)&superSection);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_108,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  for (iVar2 = 0; iVar2 < maxBindings; iVar2 = iVar2 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,this->m_queryTarget,iVar2,0,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"AfterSetting",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"After setting",(allocator<char> *)&bufferB);
  tcu::ScopedLogSection::ScopedLogSection(&superSection,pTVar1,&local_108,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&section,
             ((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&bufferB,((this->super_TestCase).m_context)->m_renderCtx);
  iVar2 = maxBindings;
  index = maxBindings / 2;
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Generic",&local_111);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"After setting generic binding point",&local_112);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_108,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  glu::CallLogWrapper::glBindBuffer(&gl,this->m_bufferTarget,local_90);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"glBindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0xfc);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (&result,&gl,this->m_queryTarget,0,0,this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Indexed",&local_111);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"After setting with glBindBufferBase",&local_112);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_108,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  glu::CallLogWrapper::glBindBufferBase(&gl,this->m_bufferTarget,0,local_90);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"glBindBufferBase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x104);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (&result,&gl,this->m_queryTarget,0,local_90,this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Indexed",&local_111);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"After setting with glBindBufferRange",&local_112);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_108,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  glu::CallLogWrapper::glBindBufferRange
            (&gl,this->m_bufferTarget,index,bufferB.super_ObjectWrapper.m_object,0,8);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"glBindBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x10c);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (&result,&gl,this->m_queryTarget,index,bufferB.super_ObjectWrapper.m_object,
             this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  if (2 < iVar2 + 1U) {
    pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"DifferentStates",&local_111);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"Original state did not change",&local_112);
    tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_108,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,this->m_queryTarget,0,local_90,this->m_verifierType);
    tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  }
  glu::ObjectWrapper::~ObjectWrapper(&bufferB.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&section);
  tcu::ScopedLogSection::~ScopedLogSection(&superSection);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

BufferBindingCase::IterateResult BufferBindingCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Initial", "Initial value");

		verifyStateInteger(result, gl, m_queryTarget, 0, m_verifierType);
	}

	{
		const tcu::ScopedLogSection	section	(m_testCtx.getLog(), "AfterBinding", "After binding");
		glu::Buffer					buf		(m_context.getRenderContext());

		gl.glBindBuffer(m_bindingPoint, *buf);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "setup");

		verifyStateInteger(result, gl, m_queryTarget, *buf, m_verifierType);
	}

	{
		const tcu::ScopedLogSection	section	(m_testCtx.getLog(), "AfterDelete", "After deleting");
		glw::GLuint					buf		= 0;

		gl.glGenBuffers(1, &buf);
		gl.glBindBuffer(m_bindingPoint, buf);
		gl.glDeleteBuffers(1, &buf);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "setup");

		verifyStateInteger(result, gl, m_queryTarget, 0, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}